

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O2

TestResult * receive_test_result(int waserror)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  RcvMsg *rmsg;
  TestResult *pTVar3;
  long lVar4;
  ck_result_ctx cVar5;
  long lStack_20;
  
  __stream = (FILE *)get_pipe();
  rewind(__stream);
  rmsg = punpack((FILE *)__stream);
  if (rmsg == (RcvMsg *)0x0) {
    eprintf("Error in call to punpack",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
            ,0x85);
  }
  teardown_pipe();
  setup_pipe();
  pTVar3 = tr_create();
  pcVar2 = rmsg->msg;
  if (waserror == 0 && pcVar2 == (char *)0x0) {
    if (rmsg->lastctx == CK_CTX_SETUP) {
      pTVar3->ctx = CK_CTX_SETUP;
      pTVar3->msg = (char *)0x0;
      lVar4 = 0x10;
      lStack_20 = 8;
    }
    else {
      pTVar3->ctx = CK_CTX_TEST;
      pTVar3->msg = (char *)0x0;
      pTVar3->duration = rmsg->duration;
      lVar4 = 0x20;
      lStack_20 = 0x18;
    }
  }
  else {
    cVar5 = rmsg->failctx;
    if (cVar5 == CK_CTX_INVALID) {
      cVar5 = rmsg->lastctx;
    }
    pTVar3->ctx = cVar5;
    pTVar3->msg = pcVar2;
    rmsg->msg = (char *)0x0;
    lVar4 = (ulong)(cVar5 == CK_CTX_TEST) * 0x10;
    lStack_20 = lVar4 + 8;
    lVar4 = lVar4 + 0x10;
  }
  pcVar2 = *(char **)((long)&rmsg->lastctx + lStack_20);
  iVar1 = *(int *)((long)&rmsg->lastctx + lVar4);
  *(undefined8 *)((long)&rmsg->lastctx + lStack_20) = 0;
  *(undefined4 *)((long)&rmsg->lastctx + lVar4) = 0xffffffff;
  pTVar3->file = pcVar2;
  pTVar3->line = iVar1;
  rcvmsg_free(rmsg);
  return pTVar3;
}

Assistant:

TestResult *receive_test_result(int waserror)
{
    FILE *fp;
    RcvMsg *rmsg;
    TestResult *result;

    fp = get_pipe();
    if(fp == NULL)
    {
        eprintf("Error in call to get_pipe", __FILE__, __LINE__ - 2);
    }

    rewind(fp);
    rmsg = punpack(fp);

    if(rmsg == NULL)
    {
        eprintf("Error in call to punpack", __FILE__, __LINE__ - 4);
    }

    teardown_pipe();
    setup_pipe();

    result = construct_test_result(rmsg, waserror);
    rcvmsg_free(rmsg);
    return result;
}